

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

void nifti_datatype_sizes(int datatype,int *nbyper,int *swapsize)

{
  int iVar1;
  int iVar3;
  int iVar2;
  
  iVar1 = 0;
  iVar2 = 0;
  if (datatype < 0x200) {
    if (datatype < 0x20) {
      if (7 < datatype) {
        if ((datatype != 8) && (iVar3 = 0, iVar1 = iVar2, datatype != 0x10)) goto LAB_0010a97c;
        goto LAB_0010a8e9;
      }
      if (datatype != 2) {
        iVar3 = 0;
        if (datatype != 4) goto LAB_0010a97c;
LAB_0010a947:
        iVar3 = 2;
        iVar1 = 2;
        goto LAB_0010a97c;
      }
    }
    else {
      if (datatype < 0x80) {
        if (datatype == 0x20) {
          iVar3 = 8;
          iVar1 = 4;
          goto LAB_0010a97c;
        }
        iVar3 = 0;
        iVar1 = iVar2;
        if (datatype != 0x40) goto LAB_0010a97c;
LAB_0010a90d:
        iVar3 = 8;
        iVar1 = 8;
        goto LAB_0010a97c;
      }
      if (datatype == 0x80) {
        iVar3 = 3;
        iVar1 = iVar2;
        goto LAB_0010a97c;
      }
      if (datatype != 0x100) goto LAB_0010a98b;
    }
    iVar3 = 1;
    iVar1 = 0;
  }
  else {
    if (0x5ff < datatype) {
      if (datatype < 0x800) {
        if (datatype == 0x600) {
          iVar3 = 0x10;
          iVar1 = 0x10;
        }
        else {
          iVar3 = 0;
          iVar1 = iVar2;
          if (datatype == 0x700) {
            iVar3 = 0x10;
            iVar1 = 8;
          }
        }
        goto LAB_0010a97c;
      }
      if (datatype == 0x800) {
        iVar3 = 0x20;
        iVar1 = 0x10;
        goto LAB_0010a97c;
      }
      if (datatype == 0x900) {
        iVar3 = 4;
        iVar1 = iVar2;
        goto LAB_0010a97c;
      }
LAB_0010a98b:
      iVar3 = 0;
      iVar1 = iVar2;
      goto LAB_0010a97c;
    }
    if (0x3ff < datatype) {
      if ((datatype != 0x400) && (iVar3 = 0, iVar1 = iVar2, datatype != 0x500)) goto LAB_0010a97c;
      goto LAB_0010a90d;
    }
    if (datatype == 0x200) goto LAB_0010a947;
    iVar3 = 0;
    iVar1 = iVar2;
    if (datatype != 0x300) goto LAB_0010a97c;
LAB_0010a8e9:
    iVar3 = 4;
    iVar1 = 4;
  }
LAB_0010a97c:
  if (nbyper != (int *)0x0) {
    *nbyper = iVar3;
  }
  if (swapsize != (int *)0x0) {
    *swapsize = iVar1;
  }
  return;
}

Assistant:

void nifti_datatype_sizes( int datatype , int *nbyper, int *swapsize )
{
   int nb=0, ss=0 ;
   switch( datatype ){
     case DT_INT8:
     case DT_UINT8:       nb =  1 ; ss =  0 ; break ;

     case DT_INT16:
     case DT_UINT16:      nb =  2 ; ss =  2 ; break ;

     case DT_RGB24:       nb =  3 ; ss =  0 ; break ;
     case DT_RGBA32:      nb =  4 ; ss =  0 ; break ;

     case DT_INT32:
     case DT_UINT32:
     case DT_FLOAT32:     nb =  4 ; ss =  4 ; break ;

     case DT_COMPLEX64:   nb =  8 ; ss =  4 ; break ;

     case DT_FLOAT64:
     case DT_INT64:
     case DT_UINT64:      nb =  8 ; ss =  8 ; break ;

     case DT_FLOAT128:    nb = 16 ; ss = 16 ; break ;

     case DT_COMPLEX128:  nb = 16 ; ss =  8 ; break ;

     case DT_COMPLEX256:  nb = 32 ; ss = 16 ; break ;
   }

   ASSIF(nbyper,nb) ; ASSIF(swapsize,ss) ; return ;
}